

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

CurveGeometry * embree::sse2::createCurves(Device *device,GType gtype)

{
  CurveGeometry *this;
  undefined **ppuVar1;
  undefined8 *puVar2;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  switch(gtype) {
  case GTY_BASIS_BEZIER:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_BEZIER);
    ppuVar1 = &PTR__CurveGeometry_021877f0;
    break;
  case GTY_ROUND_BEZIER_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_BEZIER_CURVE);
    ppuVar1 = &PTR__CurveGeometry_021875b0;
    break;
  case GTY_ORIENTED_BEZIER_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_BEZIER_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02187a18;
    break;
  default:
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid geometry type","");
    *puVar2 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar2 + 1) = 3;
    puVar2[2] = puVar2 + 4;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 2),local_38,local_38 + local_30);
    __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  case GTY_BASIS_BSPLINE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_BSPLINE);
    ppuVar1 = &PTR__CurveGeometry_02187e80;
    break;
  case GTY_ROUND_BSPLINE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_BSPLINE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02187c40;
    break;
  case GTY_ORIENTED_BSPLINE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_BSPLINE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_021880a8;
    break;
  case GTY_BASIS_HERMITE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_HERMITE);
    ppuVar1 = &PTR__CurveGeometry_02188510;
    break;
  case GTY_ROUND_HERMITE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_HERMITE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_021882d0;
    break;
  case GTY_ORIENTED_HERMITE_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_HERMITE_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02188738;
    break;
  case GTY_BASIS_CATMULL_ROM:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_BASIS_CATMULL_ROM);
    ppuVar1 = &PTR__CurveGeometry_02188ba0;
    break;
  case GTY_ROUND_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ROUND_CATMULL_ROM_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02188960;
    break;
  case GTY_ORIENTED_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)operator_new(0x250);
    CurveGeometry::CurveGeometry(this,device,GTY_ORIENTED_CATMULL_ROM_CURVE);
    ppuVar1 = &PTR__CurveGeometry_02188dc8;
  }
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)ppuVar1;
  return this;
}

Assistant:

CurveGeometry* createCurves(Device* device, Geometry::GType gtype)
    {
      switch (gtype) {
      case Geometry::GTY_ROUND_BEZIER_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
        
      case Geometry::GTY_ROUND_BSPLINE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);

      case Geometry::GTY_ROUND_HERMITE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_FLAT_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);

      case Geometry::GTY_ROUND_CATMULL_ROM_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_FLAT_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
     
      default: throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry type");
      }
    }